

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O3

tsd_t * malloc_tsd_boot0(void)

{
  _Bool _Var1;
  int iVar2;
  tsd_t *tsd;
  char *in_FS_OFFSET;
  
  ncleanups = 0;
  tsd = (tsd_t *)0x0;
  _Var1 = malloc_mutex_init(&tsd_nominal_tsds_lock,"tsd_nominal_tsds_lock",0,
                            malloc_mutex_rank_exclusive);
  if (!_Var1) {
    iVar2 = pthread_key_create(&tsd_tsd,tsd_cleanup);
    if (iVar2 == 0) {
      tsd_booted = true;
      tsd = *(tsd_t **)in_FS_OFFSET;
      if (*in_FS_OFFSET != '\0') {
        tsd_fetch_slow(tsd,false);
      }
      in_FS_OFFSET[2] = '\x01';
    }
    else {
      tsd = (tsd_t *)0x0;
    }
  }
  return tsd;
}

Assistant:

tsd_t *
malloc_tsd_boot0(void) {
	tsd_t *tsd;

	ncleanups = 0;
	if (malloc_mutex_init(&tsd_nominal_tsds_lock, "tsd_nominal_tsds_lock",
	    WITNESS_RANK_OMIT, malloc_mutex_rank_exclusive)) {
		return NULL;
	}
	if (tsd_boot0()) {
		return NULL;
	}
	tsd = tsd_fetch();
	*tsd_arenas_tdata_bypassp_get(tsd) = true;
	return tsd;
}